

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O3

void Rnm_ManCleanValues(Rnm_Man_t *p)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (long)p->vMap->nSize;
  if (0 < lVar5) {
    pGVar2 = p->pGia;
    piVar3 = p->vMap->pArray;
    lVar6 = 0;
    do {
      iVar1 = piVar3[lVar6];
      if (((long)iVar1 < 0) || (pGVar2->nObjs <= iVar1)) goto LAB_0061b199;
      pGVar4 = pGVar2->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar4[iVar1].Value = 0;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  lVar5 = (long)p->vObjs->nSize;
  if (0 < lVar5) {
    pGVar2 = p->pGia;
    piVar3 = p->vObjs->pArray;
    lVar6 = 0;
    do {
      iVar1 = piVar3[lVar6];
      if (((long)iVar1 < 0) || (pGVar2->nObjs <= iVar1)) {
LAB_0061b199:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar4 = pGVar2->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar4[iVar1].Value = 0;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  return;
}

Assistant:

void Rnm_ManCleanValues( Rnm_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObjVec( p->vMap, p->pGia, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachObjVec( p->vObjs, p->pGia, pObj, i )
        pObj->Value = 0;
}